

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QFunctionJAOHTree.cpp
# Opt level: O1

void __thiscall
QFunctionJAOHTree::SetPU(QFunctionJAOHTree *this,shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *pu)

{
  size_type sVar1;
  
  sVar1 = (this->super_QFunctionJAOH)._m_QValues.super_matrix_t.data_.size_;
  if (sVar1 != 0) {
    memset((this->super_QFunctionJAOH)._m_QValues.super_matrix_t.data_.data_,0,sVar1 << 3);
  }
  (this->super_QFunctionJAOH).field_0x38 = 0;
  boost::shared_ptr<const_PlanningUnitDecPOMDPDiscrete>::operator=
            ((shared_ptr<const_PlanningUnitDecPOMDPDiscrete> *)
             ((long)&(this->super_QFunctionJAOH)._m_QValues.super_matrix_t.size1_ +
             *(long *)((long)(this->super_QFunctionJAOH).super_QFunctionJAOHInterface + -0x88)),pu);
  return;
}

Assistant:

void QFunctionJAOHTree::SetPU(const boost::shared_ptr<const PlanningUnitDecPOMDPDiscrete> &pu)
{
    DeInitialize();
    QFunctionJAOH::SetPU(pu);
}